

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<=
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::optional_lite::optional<int>const&> *this,int *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest lVar2;
  int iVar3;
  int iVar4;
  lest *this_00;
  size_type sVar5;
  int *in_R8;
  optional<int> local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  string local_b8;
  char *local_98;
  size_type local_90;
  char local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  optional<int> local_78;
  undefined8 local_70;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  bool local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  this_00 = *(lest **)this;
  iVar3 = *rhs;
  iVar4 = *(int *)(this_00 + 4);
  lVar2 = *this_00;
  local_d8 = (optional<int>)local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"<=","");
  if (local_d8 == (optional<int>)local_c8) {
    uStack_60 = uStack_c0;
    local_78 = (optional<int>)local_68;
  }
  else {
    local_78 = local_d8;
  }
  local_70 = local_d0;
  local_d0 = 0;
  local_c8[0] = 0;
  local_d8 = (optional<int>)local_c8;
  to_string<nonstd::optional_lite::optional<int>,int>
            (&local_b8,this_00,&local_78,(string *)rhs,in_R8);
  sVar5 = local_b8._M_string_length;
  local_58 = (bool)((byte)lVar2 ^ 1 | iVar4 <= iVar3);
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == paVar1) {
    uStack_80 = local_b8.field_2._8_4_;
    uStack_7c = local_b8.field_2._12_4_;
    local_98 = local_88;
  }
  else {
    local_98 = local_b8._M_dataplus._M_p;
  }
  local_90 = local_b8._M_string_length;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity._0_4_ =
       local_b8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_98,local_98 + sVar5);
  __return_storage_ptr__->passed = local_58;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50,local_50 + local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_78 != (optional<int>)local_68) {
    operator_delete((void *)local_78);
  }
  if (local_d8 != (optional<int>)local_c8) {
    operator_delete((void *)local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }